

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

void feat_subvec_project(feat_t *fcb,mfcc_t ***inout_feat,uint32 nfr)

{
  bool bVar1;
  int *local_38;
  int32 *d;
  mfcc_t *pmStack_28;
  int32 j;
  mfcc_t *out;
  uint32 i;
  uint32 nfr_local;
  mfcc_t ***inout_feat_local;
  feat_t *fcb_local;
  
  if (fcb->subvecs != (int32 **)0x0) {
    for (out._0_4_ = 0; (uint)out < nfr; out._0_4_ = (uint)out + 1) {
      pmStack_28 = fcb->sv_buf;
      for (d._4_4_ = 0; d._4_4_ < fcb->n_sv; d._4_4_ = d._4_4_ + 1) {
        local_38 = fcb->subvecs[d._4_4_];
        while( true ) {
          bVar1 = false;
          if (local_38 != (int *)0x0) {
            bVar1 = *local_38 != -1;
          }
          if (!bVar1) break;
          *pmStack_28 = (*inout_feat[(uint)out])[*local_38];
          local_38 = local_38 + 1;
          pmStack_28 = pmStack_28 + 1;
        }
      }
      memcpy(*inout_feat[(uint)out],fcb->sv_buf,(long)fcb->sv_dim << 2);
    }
  }
  return;
}

Assistant:

static void
feat_subvec_project(feat_t *fcb, mfcc_t ***inout_feat, uint32 nfr)
{
    uint32 i;

    if (fcb->subvecs == NULL)
        return;
    for (i = 0; i < nfr; ++i) {
        mfcc_t *out;
        int32 j;

        out = fcb->sv_buf;
        for (j = 0; j < fcb->n_sv; ++j) {
            int32 *d;
            for (d = fcb->subvecs[j]; d && *d != -1; ++d) {
                *out++ = inout_feat[i][0][*d];
            }
        }
        memcpy(inout_feat[i][0], fcb->sv_buf, fcb->sv_dim * sizeof(*fcb->sv_buf));
    }
}